

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

IfStatement * __thiscall Parser::ifStmt(Parser *this)

{
  bool bVar1;
  IfStatement *pIVar2;
  IfStatement *elseStmt;
  string local_438;
  allocator<char> local_411;
  string local_410;
  Token local_3f0;
  Token local_380;
  IfStatement *local_310;
  IfStatement *elif;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  Token local_2b8;
  IfStatement *local_248;
  IfStatement *prevIf;
  IfStatement *local_1d0;
  IfStatement *ifStmt;
  Statements *stmts;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  undefined1 local_170 [8];
  Token colon;
  ExprNode *ifConditionTest;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  undefined1 local_98 [8];
  Token boolKeyword;
  vector<std::pair<ExprNode_*,_Statements_*>,_std::allocator<std::pair<ExprNode_*,_Statements_*>_>_>
  totalTestSuites;
  Parser *this_local;
  
  std::
  vector<std::pair<ExprNode_*,_Statements_*>,_std::allocator<std::pair<ExprNode_*,_Statements_*>_>_>
  ::vector((vector<std::pair<ExprNode_*,_Statements_*>,_std::allocator<std::pair<ExprNode_*,_Statements_*>_>_>
            *)((long)&boolKeyword._string.field_2 + 8));
  Tokenizer::getToken((Token *)local_98,this->tokenizer);
  bVar1 = Token::isIf((Token *)local_98);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"Parser::ifStmt",&local_c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"Expected an \'if\' token, instead got",
               (allocator<char> *)((long)&ifConditionTest + 7));
    die(this,&local_c8,&local_f0,(Token *)local_98);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&ifConditionTest + 7));
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
  }
  colon._string.field_2._8_8_ = test(this);
  Tokenizer::getToken((Token *)local_170,this->tokenizer);
  bVar1 = Token::isColon((Token *)local_170);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_190,"Parser::ifStmt",&local_191);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b8,"Expected a colon, instead got",
               (allocator<char> *)((long)&stmts + 7));
    die(this,&local_190,&local_1b8,(Token *)local_170);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&stmts + 7));
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator(&local_191);
  }
  ifStmt = (IfStatement *)suite(this);
  pIVar2 = (IfStatement *)operator_new(0x78);
  IfStatement::IfStatement(pIVar2,(ExprNode *)colon._string.field_2._8_8_,(Statements *)ifStmt);
  local_1d0 = pIVar2;
  Tokenizer::getToken((Token *)&prevIf,this->tokenizer);
  Token::operator=((Token *)local_98,(Token *)&prevIf);
  Token::~Token((Token *)&prevIf);
  local_248 = local_1d0;
  while( true ) {
    bVar1 = Token::isElif((Token *)local_98);
    if (!bVar1) break;
    colon._string.field_2._8_8_ = test(this);
    Tokenizer::getToken(&local_2b8,this->tokenizer);
    Token::operator=((Token *)local_98,&local_2b8);
    Token::~Token(&local_2b8);
    bVar1 = Token::isColon((Token *)local_98);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2d8,"Parser::ifStmt",&local_2d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_300,"Expected a colon, instead got",
                 (allocator<char> *)((long)&elif + 7));
      die(this,&local_2d8,&local_300,(Token *)local_98);
      std::__cxx11::string::~string((string *)&local_300);
      std::allocator<char>::~allocator((allocator<char> *)((long)&elif + 7));
      std::__cxx11::string::~string((string *)&local_2d8);
      std::allocator<char>::~allocator(&local_2d9);
    }
    ifStmt = (IfStatement *)suite(this);
    pIVar2 = (IfStatement *)operator_new(0x78);
    IfStatement::IfStatement(pIVar2,(ExprNode *)colon._string.field_2._8_8_,(Statements *)ifStmt);
    local_310 = pIVar2;
    IfStatement::setElif(local_248,pIVar2);
    local_248 = local_310;
    Tokenizer::getToken(&local_380,this->tokenizer);
    Token::operator=((Token *)local_98,&local_380);
    Token::~Token(&local_380);
  }
  bVar1 = Token::isElse((Token *)local_98);
  if (bVar1) {
    Tokenizer::getToken(&local_3f0,this->tokenizer);
    Token::operator=((Token *)local_98,&local_3f0);
    Token::~Token(&local_3f0);
    bVar1 = Token::isColon((Token *)local_98);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_410,"Parser::ifStmt",&local_411);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_438,"Expected a colon, instead got",
                 (allocator<char> *)((long)&elseStmt + 7));
      die(this,&local_410,&local_438,(Token *)local_98);
      std::__cxx11::string::~string((string *)&local_438);
      std::allocator<char>::~allocator((allocator<char> *)((long)&elseStmt + 7));
      std::__cxx11::string::~string((string *)&local_410);
      std::allocator<char>::~allocator(&local_411);
    }
    ifStmt = (IfStatement *)suite(this);
    pIVar2 = (IfStatement *)operator_new(0x78);
    IfStatement::IfStatement(pIVar2,(ExprNode *)0x0,(Statements *)ifStmt);
    IfStatement::setElif(local_248,pIVar2);
  }
  else {
    Tokenizer::ungetToken(this->tokenizer);
  }
  pIVar2 = local_1d0;
  Token::~Token((Token *)local_170);
  Token::~Token((Token *)local_98);
  std::
  vector<std::pair<ExprNode_*,_Statements_*>,_std::allocator<std::pair<ExprNode_*,_Statements_*>_>_>
  ::~vector((vector<std::pair<ExprNode_*,_Statements_*>,_std::allocator<std::pair<ExprNode_*,_Statements_*>_>_>
             *)((long)&boolKeyword._string.field_2 + 8));
  return pIVar2;
}

Assistant:

IfStatement *Parser::ifStmt() {
    std::vector<std::pair<ExprNode*, Statements*>>totalTestSuites;
    Token boolKeyword = tokenizer.getToken();
    if (!boolKeyword.isIf())
        die("Parser::ifStmt", "Expected an 'if' token, instead got", boolKeyword);
    ExprNode *ifConditionTest = test();

    Token colon = tokenizer.getToken();
    if(!colon.isColon())
        die("Parser::ifStmt", "Expected a colon, instead got", colon);
    Statements* stmts = suite();

    auto *ifStmt = new IfStatement(ifConditionTest, stmts);
    boolKeyword = tokenizer.getToken();
    IfStatement* prevIf = ifStmt;
    while (boolKeyword.isElif()) {
        ifConditionTest = test();
        boolKeyword = tokenizer.getToken();
        if (!boolKeyword.isColon())
            die("Parser::ifStmt", "Expected a colon, instead got", boolKeyword);
        stmts = suite();
        auto *elif = new IfStatement(ifConditionTest, stmts);
        prevIf->setElif(elif);
        prevIf = elif;
        boolKeyword = tokenizer.getToken();
    }
    if(boolKeyword.isElse()){
        boolKeyword = tokenizer.getToken();
        if (!boolKeyword.isColon())
            die("Parser::ifStmt", "Expected a colon, instead got", boolKeyword);
        stmts = suite();
        auto *elseStmt = new IfStatement(nullptr, stmts);
        prevIf->setElif(elseStmt);
    } else
        tokenizer.ungetToken();
    return ifStmt;

}